

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

char * parson_strdup(char *string)

{
  size_t __n;
  void *__dest;
  char *pcVar1;
  
  __n = strlen(string);
  __dest = (*parson_malloc)(__n + 1);
  if (__dest != (void *)0x0) {
    *(undefined1 *)((long)__dest + __n) = 0;
    pcVar1 = (char *)memcpy(__dest,string,__n);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

static char * parson_strdup(const char *string) {
    return parson_strndup(string, strlen(string));
}